

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void convolutionInit(Weight *weight,pBox *pbox,pBox *outpBox)

{
  mydataFmt *pmVar1;
  ostream *this;
  pBox *this_00;
  pBox *padpbox;
  pBox *outpBox_local;
  pBox *pbox_local;
  Weight *weight_local;
  
  outpBox->channel = weight->selfChannel;
  if (weight->kernelSize == 0) {
    outpBox->width = ((pbox->width - weight->w) + weight->padw * 2) / weight->stride + 1;
    outpBox->height = ((pbox->height - weight->h) + weight->padh * 2) / weight->stride + 1;
  }
  else {
    outpBox->width = ((pbox->width - weight->kernelSize) + weight->pad * 2) / weight->stride + 1;
    outpBox->height = ((pbox->height - weight->kernelSize) + weight->pad * 2) / weight->stride + 1;
  }
  pmVar1 = (mydataFmt *)malloc((long)(outpBox->width * outpBox->height * outpBox->channel) << 2);
  outpBox->pdata = pmVar1;
  if (outpBox->pdata == (mydataFmt *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"the convolutionInit is failed!!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  memset(outpBox->pdata,0,(long)(outpBox->width * outpBox->height * outpBox->channel) << 2);
  if (weight->pad != 0) {
    this_00 = (pBox *)operator_new(0x38);
    pBox::pBox(this_00);
    featurePadInit(pbox,this_00,weight->pad,weight->padw,weight->padh);
    featurePad(pbox,this_00,weight->pad,weight->padw,weight->padh);
    pBox::operator=(pbox,this_00);
  }
  return;
}

Assistant:

void convolutionInit(const Weight *weight, pBox *pbox, pBox *outpBox) {
    outpBox->channel = weight->selfChannel;
//    ((imginputh - ckh + 2 * ckpad) / stride) + 1;
    if (weight->kernelSize == 0) {
        outpBox->width = ((pbox->width - weight->w + 2 * weight->padw) / weight->stride) + 1;
//        outpBox->width = (pbox->width - weight->w) / weight->stride + 1;
//        outpBox->height = (pbox->height - weight->h) / weight->stride + 1;
        outpBox->height = (pbox->height - weight->h + 2 * weight->padh) / weight->stride + 1;
    } else {
        outpBox->width = ((pbox->width - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
        outpBox->height = ((pbox->height - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
    }
//    cout << outpBox->pdata << endl;
    outpBox->pdata = (mydataFmt *) malloc(outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
//    cout << outpBox->pdata << endl;
    if (outpBox->pdata == NULL)cout << "the convolutionInit is failed!!" << endl;
    memset(outpBox->pdata, 0, outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
    if (weight->pad != 0) {
        pBox *padpbox = new pBox;
        featurePadInit(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        featurePad(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        *pbox = *padpbox;
    }
}